

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

WrapMode vk::mapVkSamplerAddressMode(VkSamplerAddressMode addressMode)

{
  WrapMode local_c;
  VkSamplerAddressMode addressMode_local;
  
  switch(addressMode) {
  case VK_SAMPLER_ADDRESS_MODE_REPEAT:
    local_c = REPEAT_GL;
    break;
  case VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT:
    local_c = MIRRORED_REPEAT_GL;
    break;
  case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE:
    local_c = CLAMP_TO_EDGE;
    break;
  case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER:
    local_c = CLAMP_TO_BORDER;
    break;
  case VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE:
    local_c = MIRRORED_ONCE;
    break;
  default:
    local_c = WRAPMODE_LAST;
  }
  return local_c;
}

Assistant:

tcu::Sampler::WrapMode mapVkSamplerAddressMode (VkSamplerAddressMode addressMode)
{
	switch (addressMode)
	{
		case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE:			return tcu::Sampler::CLAMP_TO_EDGE;
		case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER:		return tcu::Sampler::CLAMP_TO_BORDER;
		case VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT:		return tcu::Sampler::MIRRORED_REPEAT_GL;
		case VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE:	return tcu::Sampler::MIRRORED_ONCE;
		case VK_SAMPLER_ADDRESS_MODE_REPEAT:				return tcu::Sampler::REPEAT_GL;
		default:
			break;
	}

	DE_ASSERT(false);
	return tcu::Sampler::WRAPMODE_LAST;
}